

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::RoundScalar(float value,int decimal_precision)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  if ((uint)decimal_precision < 10) {
    fVar3 = RoundScalar::min_steps[(uint)decimal_precision];
  }
  else {
    fVar3 = powf(10.0,(float)-decimal_precision);
  }
  fVar2 = fmodf(ABS(value),fVar3);
  uVar1 = -(uint)(fVar3 * 0.5 < fVar2);
  fVar3 = (float)(~uVar1 & (uint)-fVar2 | (uint)(fVar3 - fVar2) & uVar1) + ABS(value);
  return (float)(-(uint)(value < 0.0) & (uint)-fVar3 | ~-(uint)(value < 0.0) & (uint)fVar3);
}

Assistant:

float ImGui::RoundScalar(float value, int decimal_precision)
{
    // Round past decimal precision
    // So when our value is 1.99999 with a precision of 0.001 we'll end up rounding to 2.0
    // FIXME: Investigate better rounding methods
    static const float min_steps[10] = { 1.0f, 0.1f, 0.01f, 0.001f, 0.0001f, 0.00001f, 0.000001f, 0.0000001f, 0.00000001f, 0.000000001f };
    float min_step = (decimal_precision >= 0 && decimal_precision < 10) ? min_steps[decimal_precision] : powf(10.0f, (float)-decimal_precision);
    bool negative = value < 0.0f;
    value = fabsf(value);
    float remainder = fmodf(value, min_step);
    if (remainder <= min_step*0.5f)
        value -= remainder;
    else
        value += (min_step - remainder);
    return negative ? -value : value;
}